

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_452187::HandleGlobImpl
          (anon_unknown_dwarf_452187 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse,cmExecutionStatus *status)

{
  bool bVar1;
  WorkingMode WVar2;
  uint uVar3;
  long lVar4;
  pointer pcVar5;
  cmMakefile *pcVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer pMVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  PolicyStatus PVar13;
  int iVar14;
  uint uVar15;
  undefined4 extraout_var;
  long *plVar16;
  undefined8 *puVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 extraout_RAX;
  undefined7 uVar21;
  char *pcVar18;
  char *__s;
  ulong uVar19;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var20;
  size_type *psVar22;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID extraout_EDX_02;
  PolicyID extraout_EDX_03;
  PolicyID extraout_EDX_04;
  PolicyID extraout_EDX_05;
  PolicyID extraout_EDX_06;
  PolicyID extraout_EDX_07;
  PolicyID id;
  undefined7 in_register_00000011;
  undefined8 *puVar23;
  char *extraout_RDX;
  pointer pMVar24;
  undefined8 uVar25;
  _Alloc_hider _Var26;
  string *in_name;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value_00;
  string_view separator;
  string_view value_01;
  undefined1 auVar27 [12];
  bool local_1d1;
  undefined1 local_1c8 [32];
  undefined8 local_1a8;
  char *local_1a0;
  cmExecutionStatus *local_198;
  pointer local_190;
  cmExecutionStatus *local_188;
  uint local_17c;
  string local_178;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  undefined4 local_144;
  cmake *local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined8 local_f0;
  string expr;
  string variable;
  GlobMessages globMessages;
  Glob g;
  
  puVar23 = (undefined8 *)CONCAT71(in_register_00000011,recurse);
  lVar4 = *(long *)this;
  local_188 = (cmExecutionStatus *)this;
  if ((ulong)(*(long *)(this + 8) - lVar4) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileCommand.cxx"
                  ,0x26f,
                  "bool (anonymous namespace)::HandleGlobImpl(const std::vector<std::string> &, bool, cmExecutionStatus &)"
                 );
  }
  uVar19 = (ulong)args & 0xffffffff;
  variable._M_dataplus._M_p = (pointer)&variable.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&variable,*(long *)(lVar4 + 0x20),
             *(long *)(lVar4 + 0x28) + *(long *)(lVar4 + 0x20));
  cmsys::Glob::Glob(&g);
  g.Recurse = (bool)(byte)uVar19;
  PVar13 = cmMakefile::GetPolicyStatus((cmMakefile *)*puVar23,CMP0009,false);
  local_f0 = CONCAT44(extraout_var,PVar13);
  if ((PVar13 < (REQUIRED_ALWAYS|WARN) & (byte)uVar19) != 0) {
    status = (cmExecutionStatus *)(ulong)(PVar13 * 8);
    g.RecurseThroughSymlinks = SUB81(0x101L >> ((byte)(PVar13 * 8) & 0x3f),0);
  }
  local_140 = cmMakefile::GetCMakeInstance((cmMakefile *)*puVar23);
  in_name = (string *)(lVar4 + 0x40);
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d1 = in_name == (string *)(local_188->Error)._M_dataplus._M_p;
  if (local_1d1) {
    bVar12 = 1;
    id = extraout_EDX;
  }
  else {
    WVar2 = local_140->CurrentWorkingMode;
    local_148 = 0;
    local_14c = 0;
    local_150 = 0;
    local_154 = 0;
    local_17c = (uint)args;
    do {
      iVar14 = std::__cxx11::string::compare((char *)in_name);
      if (iVar14 == 0) {
        if (in_name + 1 == (string *)(local_188->Error)._M_dataplus._M_p) {
          local_1c8._0_8_ = local_1c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"LIST_DIRECTORIES missing bool value.","");
          std::__cxx11::string::_M_assign((string *)(puVar23 + 1));
          goto LAB_001db023;
        }
        value._M_str = extraout_RDX;
        value._M_len = (size_t)in_name[1]._M_dataplus._M_p;
        status = local_188;
        bVar11 = cmValue::IsOn((cmValue *)in_name[1]._M_string_length,value);
        if (bVar11) {
          g.ListDirs = true;
          g.RecurseListDirs = true;
          id = extraout_EDX_01;
        }
        else {
          value_00._M_str = in_name[1]._M_dataplus._M_p;
          value_00._M_len = in_name[1]._M_string_length;
          bVar11 = cmValue::IsOff(value_00);
          if (!bVar11) {
            local_1c8._0_8_ = local_1c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"LIST_DIRECTORIES missing bool value.","");
            std::__cxx11::string::_M_assign((string *)(puVar23 + 1));
            goto LAB_001db023;
          }
          g.ListDirs = false;
          g.RecurseListDirs = false;
          id = extraout_EDX_02;
        }
        in_name = in_name + 2;
      }
      else {
        auVar27 = std::__cxx11::string::compare((char *)in_name);
        id = auVar27._8_4_;
        if (auVar27._0_4_ != 0) {
          iVar14 = std::__cxx11::string::compare((char *)in_name);
          if (iVar14 == 0) {
            if (in_name + 1 == (string *)(local_188->Error)._M_dataplus._M_p) {
              local_1c8._0_8_ = local_1c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"GLOB requires a directory after the RELATIVE tag.","")
              ;
              std::__cxx11::string::_M_assign((string *)(puVar23 + 1));
            }
            else {
              status = local_188;
              cmsys::Glob::SetRelative(&g,in_name[1]._M_dataplus._M_p);
              in_name = in_name + 2;
              id = extraout_EDX_03;
              if (in_name != (string *)(local_188->Error)._M_dataplus._M_p) goto LAB_001dad11;
              local_1c8._0_8_ = local_1c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"GLOB requires a glob expression after the directory.",
                         "");
              std::__cxx11::string::_M_assign((string *)(puVar23 + 1));
            }
          }
          else {
            iVar14 = std::__cxx11::string::compare((char *)in_name);
            if (iVar14 != 0) {
              expr._M_dataplus._M_p = (pointer)&expr.field_2;
              pcVar5 = (in_name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&expr,pcVar5,pcVar5 + in_name->_M_string_length);
              bVar11 = cmsys::SystemTools::FileIsFullPath(in_name);
              if (!bVar11) {
                cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)*puVar23);
                std::__cxx11::string::_M_assign((string *)&expr);
                if (expr._M_string_length == 0) {
                  std::__cxx11::string::_M_assign((string *)&expr);
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1c8,"/",in_name);
                  std::__cxx11::string::_M_append((char *)&expr,local_1c8._0_8_);
                  if ((cmExecutionStatus *)local_1c8._0_8_ !=
                      (cmExecutionStatus *)(local_1c8 + 0x10)) {
                    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
                  }
                }
              }
              globMessages.
              super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              globMessages.
              super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              globMessages.
              super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmsys::Glob::FindFiles(&g,&expr,&globMessages);
              pMVar9 = globMessages.
                       super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (globMessages.
                  super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  globMessages.
                  super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
LAB_001dab04:
                uVar3 = local_17c;
                bVar11 = SUB41(local_17c,0);
                if (((bVar11 != false) && ((local_148 & 1) == 0)) &&
                   (local_154 = local_154 & 0xff, g.FollowedSymlinkCount != 0)) {
                  local_154 = 1;
                }
                this_00 = cmsys::Glob::GetFiles_abi_cxx11_(&g);
                status = (cmExecutionStatus *)
                         (this_00->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &files,files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                           (this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,status);
                uVar21 = (undefined7)((ulong)extraout_RAX >> 8);
                local_144 = (undefined4)CONCAT71(uVar21,1);
                uVar15 = (uint)CONCAT71(uVar21,1);
                if ((local_14c & 1) != 0) {
                  pbVar7 = (this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  pbVar8 = (this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                  if (pbVar7 != pbVar8) {
                    uVar19 = (long)pbVar8 - (long)pbVar7 >> 5;
                    lVar4 = 0x3f;
                    if (uVar19 != 0) {
                      for (; uVar19 >> lVar4 == 0; lVar4 = lVar4 + -1) {
                      }
                    }
                    std::
                    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                              (pbVar7,pbVar8,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
                    std::
                    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                              (pbVar7,pbVar8);
                  }
                  _Var20 = std::
                           __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                                     ((this_00->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start,
                                      (this_00->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase(this_00,(iterator)_Var20._M_current,
                             (this_00->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
                  bVar10 = g.RecurseThroughSymlinks;
                  bVar1 = (&g.ListDirs)[bVar11];
                  pcVar18 = cmsys::Glob::GetRelative(&g);
                  __s = "";
                  if (pcVar18 != (char *)0x0) {
                    __s = cmsys::Glob::GetRelative(&g);
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_1c8,__s,(allocator<char> *)&local_110);
                  cmMakefile::GetBacktrace((cmMakefile *)*puVar23);
                  status = (cmExecutionStatus *)0x0;
                  cmake::AddGlobCacheEntry
                            (local_140,bVar11,(bool)(bVar1 & 1),(bool)(bVar10 & (byte)local_17c),
                             (string *)local_1c8,&expr,this_00,&variable,
                             (cmListFileBacktrace *)&local_178);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_string_length !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_178._M_string_length);
                  }
                  uVar3 = local_17c;
                  uVar15 = local_150;
                  if ((cmExecutionStatus *)local_1c8._0_8_ !=
                      (cmExecutionStatus *)(local_1c8 + 0x10)) {
                    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
                    uVar15 = local_150;
                  }
                }
                in_name = in_name + 1;
                local_150 = uVar15;
              }
              else {
                bVar11 = false;
                pMVar24 = globMessages.
                          super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  if (pMVar24->type == error) {
                    pcVar6 = (cmMakefile *)*puVar23;
                    std::operator+(&local_110,"Error has occurred while globbing for \'",in_name);
                    plVar16 = (long *)std::__cxx11::string::append((char *)&local_110);
                    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                    psVar22 = (size_type *)(plVar16 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar16 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar22) {
                      local_178.field_2._M_allocated_capacity = *psVar22;
                      local_178.field_2._8_8_ = plVar16[3];
                    }
                    else {
                      local_178.field_2._M_allocated_capacity = *psVar22;
                      local_178._M_dataplus._M_p = (pointer)*plVar16;
                    }
                    local_178._M_string_length = plVar16[1];
                    *plVar16 = (long)psVar22;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    puVar17 = (undefined8 *)
                              std::__cxx11::string::_M_append
                                        ((char *)&local_178,
                                         (ulong)(pMVar24->content)._M_dataplus._M_p);
                    local_1c8._0_8_ = local_1c8 + 0x10;
                    status = (cmExecutionStatus *)(puVar17 + 2);
                    if ((cmExecutionStatus *)*puVar17 == status) {
                      local_1c8._16_8_ = ((_Alloc_hider *)&status->Makefile)->_M_p;
                      local_1c8._24_8_ = puVar17[3];
                    }
                    else {
                      local_1c8._16_8_ = ((_Alloc_hider *)&status->Makefile)->_M_p;
                      local_1c8._0_8_ = (cmExecutionStatus *)*puVar17;
                    }
                    local_1c8._8_8_ = puVar17[1];
                    *puVar17 = status;
                    puVar17[1] = 0;
                    *(undefined1 *)(puVar17 + 2) = 0;
                    cmMakefile::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_1c8);
                    if ((cmExecutionStatus *)local_1c8._0_8_ !=
                        (cmExecutionStatus *)(local_1c8 + 0x10)) {
                      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != &local_178.field_2) {
                      operator_delete(local_178._M_dataplus._M_p,
                                      local_178.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_110._M_dataplus._M_p != &local_110.field_2) {
                      operator_delete(local_110._M_dataplus._M_p,
                                      local_110.field_2._M_allocated_capacity + 1);
                    }
                    bVar11 = true;
                  }
                  else if (pMVar24->type == cyclicRecursion) {
                    pcVar6 = (cmMakefile *)*puVar23;
                    std::operator+(&local_110,"Cyclic recursion detected while globbing for \'",
                                   in_name);
                    plVar16 = (long *)std::__cxx11::string::append((char *)&local_110);
                    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                    psVar22 = (size_type *)(plVar16 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar16 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar22) {
                      local_178.field_2._M_allocated_capacity = *psVar22;
                      local_178.field_2._8_8_ = plVar16[3];
                    }
                    else {
                      local_178.field_2._M_allocated_capacity = *psVar22;
                      local_178._M_dataplus._M_p = (pointer)*plVar16;
                    }
                    local_178._M_string_length = plVar16[1];
                    *plVar16 = (long)psVar22;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    plVar16 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_178,
                                                 (ulong)(pMVar24->content)._M_dataplus._M_p);
                    local_1c8._0_8_ = local_1c8 + 0x10;
                    status = (cmExecutionStatus *)(plVar16 + 2);
                    if ((cmExecutionStatus *)*plVar16 == status) {
                      local_1c8._16_8_ = ((_Alloc_hider *)&status->Makefile)->_M_p;
                      local_1c8._24_8_ = plVar16[3];
                    }
                    else {
                      local_1c8._16_8_ = ((_Alloc_hider *)&status->Makefile)->_M_p;
                      local_1c8._0_8_ = (cmExecutionStatus *)*plVar16;
                    }
                    local_1c8._8_8_ = plVar16[1];
                    *plVar16 = (long)status;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,(string *)local_1c8);
                    if ((cmExecutionStatus *)local_1c8._0_8_ !=
                        (cmExecutionStatus *)(local_1c8 + 0x10)) {
                      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != &local_178.field_2) {
                      operator_delete(local_178._M_dataplus._M_p,
                                      local_178.field_2._M_allocated_capacity + 1);
                    }
                    uVar25 = local_110.field_2._M_allocated_capacity;
                    _Var26._M_p = local_110._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_001daa41:
                      operator_delete(_Var26._M_p,uVar25 + 1);
                    }
                  }
                  else if ((local_140->DebugOutput != false) || (local_140->Trace == true)) {
                    pcVar6 = (cmMakefile *)*puVar23;
                    local_1c8._24_8_ = (in_name->_M_dataplus)._M_p;
                    local_1c8._16_8_ = in_name->_M_string_length;
                    local_1c8._0_8_ = (cmExecutionStatus *)0xf;
                    local_1c8._8_8_ = "Globbing for\n  ";
                    local_1a8 = 0x18;
                    local_1a0 = "\nEncountered an error:\n ";
                    local_190 = (pMVar24->content)._M_dataplus._M_p;
                    status = (cmExecutionStatus *)(pMVar24->content)._M_string_length;
                    views._M_len = 4;
                    views._M_array = (iterator)local_1c8;
                    local_198 = status;
                    cmCatViews_abi_cxx11_(&local_178,views);
                    cmMakefile::IssueMessage(pcVar6,LOG,&local_178);
                    uVar25 = local_178.field_2._M_allocated_capacity;
                    _Var26._M_p = local_178._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_001daa41;
                  }
                  pMVar24 = pMVar24 + 1;
                } while (pMVar24 != pMVar9);
                if (!bVar11) goto LAB_001dab04;
                local_144 = 0;
                uVar3 = local_17c;
              }
              uVar19 = (ulong)uVar3;
              std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector
                        (&globMessages);
              id = extraout_EDX_06;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)expr._M_dataplus._M_p != &expr.field_2) {
                operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
                id = extraout_EDX_07;
              }
              if ((char)local_144 != '\0') goto LAB_001dad11;
              goto LAB_001dae48;
            }
            id = extraout_EDX_00;
            if (((local_14c & 1) == 0) && ((local_150 & 1) != 0)) {
              pcVar6 = (cmMakefile *)*puVar23;
              local_1c8._0_8_ = local_1c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,
                         "CONFIGURE_DEPENDS flag was given after a glob expression was already evaluated."
                         ,"");
              cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,(string *)local_1c8);
              id = extraout_EDX_04;
              if ((cmExecutionStatus *)local_1c8._0_8_ != (cmExecutionStatus *)(local_1c8 + 0x10)) {
                operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
                id = extraout_EDX_05;
              }
            }
            if (WVar2 == NORMAL_MODE) {
              in_name = in_name + 1;
              status = (cmExecutionStatus *)CONCAT71((int7)((ulong)status >> 8),1);
              local_14c = (uint)status;
              if (in_name != (string *)(local_188->Error)._M_dataplus._M_p) goto LAB_001dad11;
              local_1c8._0_8_ = local_1c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,
                         "GLOB requires a glob expression after CONFIGURE_DEPENDS.","");
              std::__cxx11::string::_M_assign((string *)(puVar23 + 1));
            }
            else {
              pcVar6 = (cmMakefile *)*puVar23;
              local_1c8._0_8_ = local_1c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,
                         "CONFIGURE_DEPENDS is invalid for script and find package modes.","");
              cmMakefile::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_1c8);
            }
          }
LAB_001db023:
          if ((cmExecutionStatus *)local_1c8._0_8_ == (cmExecutionStatus *)(local_1c8 + 0x10))
          goto LAB_001dae48;
          goto LAB_001dae3b;
        }
        in_name = in_name + 1;
        if ((char)uVar19 != '\0') {
          g.RecurseThroughSymlinks = true;
          local_148 = (uint)CONCAT71(auVar27._1_7_,1);
          if (in_name == (string *)(local_188->Error)._M_dataplus._M_p) {
            local_1c8._0_8_ = local_1c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,
                       "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.","");
            std::__cxx11::string::_M_assign((string *)(puVar23 + 1));
            goto LAB_001db023;
          }
        }
      }
LAB_001dad11:
      local_1d1 = in_name == (string *)(local_188->Error)._M_dataplus._M_p;
    } while (!local_1d1);
    bVar12 = (byte)local_154 ^ 1;
  }
  if (((uint)local_f0 < 2) && ((bVar12 & 1) == 0)) {
    pcVar6 = (cmMakefile *)*puVar23;
    cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1c8,(cmPolicies *)0x9,id);
    cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,(string *)local_1c8);
    if ((cmExecutionStatus *)local_1c8._0_8_ != (cmExecutionStatus *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
  }
  pbVar8 = files.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = files.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar19 = (long)files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar4 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar7,pbVar8);
  }
  _Var20 = std::
           __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&files,(iterator)_Var20._M_current,
             (iterator)
             files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pcVar6 = (cmMakefile *)*puVar23;
  separator._M_str = ";";
  separator._M_len = 1;
  cmJoin((string *)local_1c8,&files,separator,(string_view)ZEXT816(0));
  value_01._M_str = (char *)local_1c8._0_8_;
  value_01._M_len = local_1c8._8_8_;
  cmMakefile::AddDefinition(pcVar6,&variable,value_01);
  if ((cmExecutionStatus *)local_1c8._0_8_ != (cmExecutionStatus *)(local_1c8 + 0x10)) {
LAB_001dae3b:
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
LAB_001dae48:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  cmsys::Glob::~Glob(&g);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)variable._M_dataplus._M_p != &variable.field_2) {
    operator_delete(variable._M_dataplus._M_p,variable.field_2._M_allocated_capacity + 1);
  }
  return local_1d1;
}

Assistant:

bool HandleGlobImpl(std::vector<std::string> const& args, bool recurse,
                    cmExecutionStatus& status)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  auto i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus policyStatus =
    status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0009);
  if (recurse) {
    switch (policyStatus) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::WARN:
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        g.RecurseThroughSymlinksOn();
        break;
    }
  }

  cmake* cm = status.GetMakefile().GetCMakeInstance();
  std::vector<std::string> files;
  bool configureDepends = false;
  bool warnConfigureLate = false;
  bool warnFollowedSymlinks = false;
  const cmake::WorkingMode workingMode = cm->GetWorkingMode();
  while (i != args.end()) {
    if (*i == "LIST_DIRECTORIES") {
      ++i; // skip LIST_DIRECTORIES
      if (i != args.end()) {
        if (cmIsOn(*i)) {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
        } else if (cmIsOff(*i)) {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
        } else {
          status.SetError("LIST_DIRECTORIES missing bool value.");
          return false;
        }
        ++i;
      } else {
        status.SetError("LIST_DIRECTORIES missing bool value.");
        return false;
      }
    } else if (*i == "FOLLOW_SYMLINKS") {
      ++i; // skip FOLLOW_SYMLINKS
      if (recurse) {
        explicitFollowSymlinks = true;
        g.RecurseThroughSymlinksOn();
        if (i == args.end()) {
          status.SetError(
            "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.");
          return false;
        }
      }
    } else if (*i == "RELATIVE") {
      ++i; // skip RELATIVE
      if (i == args.end()) {
        status.SetError("GLOB requires a directory after the RELATIVE tag.");
        return false;
      }
      g.SetRelative(i->c_str());
      ++i;
      if (i == args.end()) {
        status.SetError(
          "GLOB requires a glob expression after the directory.");
        return false;
      }
    } else if (*i == "CONFIGURE_DEPENDS") {
      // Generated build system depends on glob results
      if (!configureDepends && warnConfigureLate) {
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          "CONFIGURE_DEPENDS flag was given after a glob expression was "
          "already evaluated.");
      }
      if (workingMode != cmake::NORMAL_MODE) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          "CONFIGURE_DEPENDS is invalid for script and find package modes.");
        return false;
      }
      configureDepends = true;
      ++i;
      if (i == args.end()) {
        status.SetError(
          "GLOB requires a glob expression after CONFIGURE_DEPENDS.");
        return false;
      }
    } else {
      std::string expr = *i;
      if (!cmsys::SystemTools::FileIsFullPath(*i)) {
        expr = status.GetMakefile().GetCurrentSourceDirectory();
        // Handle script mode
        if (!expr.empty()) {
          expr += "/" + *i;
        } else {
          expr = *i;
        }
      }

      cmsys::Glob::GlobMessages globMessages;
      g.FindFiles(expr, &globMessages);

      if (!globMessages.empty()) {
        bool shouldExit = false;
        for (cmsys::Glob::Message const& globMessage : globMessages) {
          if (globMessage.type == cmsys::Glob::cyclicRecursion) {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              "Cyclic recursion detected while globbing for '" + *i + "':\n" +
                globMessage.content);
          } else if (globMessage.type == cmsys::Glob::error) {
            status.GetMakefile().IssueMessage(
              MessageType::FATAL_ERROR,
              "Error has occurred while globbing for '" + *i + "' - " +
                globMessage.content);
            shouldExit = true;
          } else if (cm->GetDebugOutput() || cm->GetTrace()) {
            status.GetMakefile().IssueMessage(
              MessageType::LOG,
              cmStrCat("Globbing for\n  ", *i, "\nEncountered an error:\n ",
                       globMessage.content));
          }
        }
        if (shouldExit) {
          return false;
        }
      }

      if (recurse && !explicitFollowSymlinks &&
          g.GetFollowedSymlinkCount() != 0) {
        warnFollowedSymlinks = true;
      }

      std::vector<std::string>& foundFiles = g.GetFiles();
      cm::append(files, foundFiles);

      if (configureDepends) {
        std::sort(foundFiles.begin(), foundFiles.end());
        foundFiles.erase(std::unique(foundFiles.begin(), foundFiles.end()),
                         foundFiles.end());
        cm->AddGlobCacheEntry(
          recurse, (recurse ? g.GetRecurseListDirs() : g.GetListDirs()),
          (recurse ? g.GetRecurseThroughSymlinks() : false),
          (g.GetRelative() ? g.GetRelative() : ""), expr, foundFiles, variable,
          status.GetMakefile().GetBacktrace());
      } else {
        warnConfigureLate = true;
      }
      ++i;
    }
  }

  switch (policyStatus) {
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Correct behavior, yay!
      break;
    case cmPolicies::OLD:
    // Probably not really the expected behavior, but the author explicitly
    // asked for the old behavior... no warning.
    case cmPolicies::WARN:
      // Possibly unexpected old behavior *and* we actually traversed
      // symlinks without being explicitly asked to: warn the author.
      if (warnFollowedSymlinks) {
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
      }
      break;
  }

  std::sort(files.begin(), files.end());
  files.erase(std::unique(files.begin(), files.end()), files.end());
  status.GetMakefile().AddDefinition(variable, cmJoin(files, ";"));
  return true;
}